

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

DdNode * Abc_NodeCollapseFunc
                   (Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins,int *pPermFanin,
                   int *pPermFanout)

{
  DdManager *dd;
  int *permut;
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *n;
  DdNode *n_00;
  int iFanin;
  int local_44;
  int *local_40;
  int *local_38;
  
  dd = (DdManager *)pFanin->pNtk->pManFunc;
  iVar1 = Abc_NodeCheckDupFanin(pFanin,pFanout,&local_44);
  if (iVar1 == 1) {
    local_40 = pPermFanout;
    iVar1 = Abc_NodeCollapseSuppSize(pFanin,pFanout,vFanins);
    Cudd_bddIthVar(dd,iVar1 + -1);
    if (dd->size < iVar1) {
      __assert_fail("nSize <= dd->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                    ,0x181,
                    "DdNode *Abc_NodeCollapseFunc(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    iVar1 = Abc_NodeCollapsePermMap(pFanin,(Abc_Obj_t *)0x0,vFanins,pPermFanin);
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                    ,0x184,
                    "DdNode *Abc_NodeCollapseFunc(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    local_38 = pPermFanin;
    iVar1 = Abc_NodeCollapsePermMap(pFanout,pFanin,vFanins,local_40);
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                    ,0x186,
                    "DdNode *Abc_NodeCollapseFunc(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    pDVar2 = Cudd_bddIthVar(dd,local_44);
    pDVar3 = Cudd_Cofactor(dd,(DdNode *)(pFanout->field_5).pData,(DdNode *)((ulong)pDVar2 ^ 1));
    Cudd_Ref(pDVar3);
    pDVar2 = Cudd_Cofactor(dd,(DdNode *)(pFanout->field_5).pData,pDVar2);
    Cudd_Ref(pDVar2);
    permut = local_40;
    n = Cudd_bddPermute(dd,pDVar3,local_40);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,pDVar3);
    pDVar3 = Cudd_bddPermute(dd,pDVar2,permut);
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,pDVar2);
    n_00 = Cudd_bddPermute(dd,(DdNode *)(pFanin->field_5).pData,local_38);
    Cudd_Ref(n_00);
    pDVar2 = Cudd_bddIte(dd,n_00,pDVar3,n);
    Cudd_Ref(pDVar2);
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDeref(dd,pDVar3);
    Cudd_RecursiveDeref(dd,n);
    Cudd_Deref(pDVar2);
  }
  else {
    pDVar2 = (DdNode *)0x0;
  }
  return pDVar2;
}

Assistant:

DdNode * Abc_NodeCollapseFunc( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins, int * pPermFanin, int * pPermFanout )
{
    DdManager * dd = (DdManager *)pFanin->pNtk->pManFunc;
    DdNode * bVar, * bFunc0, * bFunc1, * bTemp, * bFanin, * bFanout;
    int RetValue, nSize, iFanin;
    // can only eliminate if fanin occurs in the fanin list of the fanout exactly once
    if ( Abc_NodeCheckDupFanin( pFanin, pFanout, &iFanin ) != 1 )
        return NULL;
    // find the new number of fanins after collapsing
    nSize = Abc_NodeCollapseSuppSize( pFanin, pFanout, vFanins );
    bVar = Cudd_bddIthVar( dd, nSize - 1 );
    assert( nSize <= dd->size );
    // find the permutation after collapsing
    RetValue = Abc_NodeCollapsePermMap( pFanin, NULL, vFanins, pPermFanin );
    assert( RetValue );
    RetValue = Abc_NodeCollapsePermMap( pFanout, pFanin, vFanins, pPermFanout );
    assert( RetValue );
    // cofactor the local function of the node
    bVar   = Cudd_bddIthVar( dd, iFanin );
    bFunc0 = Cudd_Cofactor( dd, (DdNode *)pFanout->pData, Cudd_Not(bVar) ); Cudd_Ref( bFunc0 );
    bFunc1 = Cudd_Cofactor( dd, (DdNode *)pFanout->pData, bVar );           Cudd_Ref( bFunc1 );
    // find the permutation after collapsing
    bFunc0 = Cudd_bddPermute( dd, bTemp = bFunc0, pPermFanout );  Cudd_Ref( bFunc0 );
    Cudd_RecursiveDeref( dd, bTemp ); 
    bFunc1 = Cudd_bddPermute( dd, bTemp = bFunc1, pPermFanout );  Cudd_Ref( bFunc1 );
    Cudd_RecursiveDeref( dd, bTemp );
    bFanin = Cudd_bddPermute( dd, (DdNode *)pFanin->pData, pPermFanin );    Cudd_Ref( bFanin );
    // create the new function
    bFanout = Cudd_bddIte( dd, bFanin, bFunc1, bFunc0 );          Cudd_Ref( bFanout );
    Cudd_RecursiveDeref( dd, bFanin );
    Cudd_RecursiveDeref( dd, bFunc1 );
    Cudd_RecursiveDeref( dd, bFunc0 );
    Cudd_Deref( bFanout );
    return bFanout;
}